

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Button.cxx
# Opt level: O1

int __thiscall Fl_Menu_Button::handle(Fl_Menu_Button *this,int e)

{
  byte bVar1;
  int iVar2;
  Fl_Menu_Item *pFVar3;
  bool bVar4;
  
  pFVar3 = (this->super_Fl_Menu_).menu_;
  if ((pFVar3 == (Fl_Menu_Item *)0x0) || (pFVar3->text == (char *)0x0)) {
LAB_00185221:
    bVar4 = false;
    goto switchD_00185146_caseD_2;
  }
  bVar4 = false;
  switch(e) {
  case 1:
    if ((this->super_Fl_Menu_).super_Fl_Widget.box_ == '\0') {
      if (Fl::e_keysym != 0xfeeb) goto LAB_00185221;
    }
    else {
      bVar1 = (this->super_Fl_Menu_).super_Fl_Widget.type_;
      if ((bVar1 != 0) && ((bVar1 >> ((byte)((char)Fl::e_keysym + 0x17) & 0x1f) & 1) == 0))
      goto LAB_00185221;
    }
    bVar4 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar4) {
      Fl::focus((Fl_Widget *)this);
    }
    break;
  default:
    goto switchD_00185146_caseD_2;
  case 3:
  case 4:
    if ((this->super_Fl_Menu_).super_Fl_Widget.box_ != '\0') {
      bVar4 = (this->super_Fl_Menu_).super_Fl_Widget.type_ == '\0';
      goto switchD_00185146_caseD_2;
    }
    goto LAB_00185221;
  case 6:
  case 7:
    if (((this->super_Fl_Menu_).super_Fl_Widget.box_ == '\0') ||
       (bVar4 = Fl::option(OPTION_VISIBLE_FOCUS), !bVar4)) goto LAB_00185221;
    Fl_Widget::redraw((Fl_Widget *)this);
    goto LAB_0018520e;
  case 8:
    bVar4 = false;
    if (((this->super_Fl_Menu_).super_Fl_Widget.box_ == '\0') || (Fl::e_keysym != 0x20))
    goto switchD_00185146_caseD_2;
    if ((Fl::e_state._2_1_ & 0x4d) != 0) goto LAB_00185221;
    break;
  case 0xc:
    iVar2 = Fl_Widget::test_shortcut((Fl_Widget *)this);
    if (iVar2 == 0) {
      pFVar3 = Fl_Menu_::test_shortcut(&this->super_Fl_Menu_);
      bVar4 = pFVar3 != (Fl_Menu_Item *)0x0;
      goto switchD_00185146_caseD_2;
    }
  }
  popup(this);
LAB_0018520e:
  bVar4 = true;
switchD_00185146_caseD_2:
  return (int)bVar4;
}

Assistant:

int Fl_Menu_Button::handle(int e) {
  if (!menu() || !menu()->text) return 0;
  switch (e) {
  case FL_ENTER: /* FALLTHROUGH */
  case FL_LEAVE:
    return (box() && !type()) ? 1 : 0;
  case FL_PUSH:
    if (!box()) {
      if (Fl::event_button() != 3) return 0;
    } else if (type()) {
      if (!(type() & (1 << (Fl::event_button()-1)))) return 0;
    }
    if (Fl::visible_focus()) Fl::focus(this);
    popup();
    return 1;
  case FL_KEYBOARD:
    if (!box()) return 0;
    if (Fl::event_key() == ' ' &&
        !(Fl::event_state() & (FL_SHIFT | FL_CTRL | FL_ALT | FL_META))) {
      popup();
      return 1;
    } else return 0;
  case FL_SHORTCUT:
    if (Fl_Widget::test_shortcut()) {popup(); return 1;}
    return test_shortcut() != 0;
  case FL_FOCUS: /* FALLTHROUGH */
  case FL_UNFOCUS:
    if (box() && Fl::visible_focus()) {
      redraw();
      return 1;
    }
  default:
    return 0;
  }
}